

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauNpn2.c
# Opt level: O0

void Dtt_PrintMulti2(Dtt_Man_t *p)

{
  uint local_18;
  int local_14;
  int n;
  int i;
  Dtt_Man_t *p_local;
  
  for (local_18 = 0; (int)local_18 < 8; local_18 = local_18 + 1) {
    printf("n=%d : ",(ulong)local_18);
    for (local_14 = 0; local_14 < p->nClasses; local_14 = local_14 + 1) {
      if (p->pNodes[local_14] == local_18) {
        printf("%d ",(ulong)(uint)p->pTimes[local_14]);
      }
    }
    printf("\n");
  }
  return;
}

Assistant:

void Dtt_PrintMulti2( Dtt_Man_t * p )
{
    int i, n;
    for ( n = 0; n <= 7; n++ )
    {
        printf( "n=%d : ", n);
        for ( i = 0; i < p->nClasses; i++ )
            if ( p->pNodes[i] == n )
                printf( "%d ", p->pTimes[i] );
        printf( "\n" );
    }
}